

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_load.c
# Opt level: O0

int lua_loadx(lua_State *L,lua_Reader reader,void *data,char *chunkname,char *mode)

{
  int iVar1;
  GCstr *local_108;
  undefined1 local_f8 [4];
  int status;
  LexState ls;
  char *mode_local;
  char *chunkname_local;
  void *data_local;
  lua_Reader reader_local;
  lua_State *L_local;
  
  local_108 = (GCstr *)chunkname;
  if (chunkname == (char *)0x0) {
    local_108 = (GCstr *)0x1bb458;
  }
  ls.chunkname = local_108;
  ls.sb.e = (char *)0x0;
  ls.sb.w = (char *)0x0;
  ls.lookahead = 0;
  ls._60_4_ = 0;
  ls.sb.L.ptr64 = (uint64_t)reader;
  ls.rfunc = (lua_Reader)data;
  ls.chunkarg = mode;
  ls._176_8_ = mode;
  ls.sb.b = (char *)L;
  iVar1 = lj_vm_cpcall(L,0,local_f8,cpparser);
  lj_lex_cleanup(L,(LexState *)local_f8);
  if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
    lj_gc_step(L);
  }
  return iVar1;
}

Assistant:

LUA_API int lua_loadx(lua_State *L, lua_Reader reader, void *data,
		      const char *chunkname, const char *mode)
{
  LexState ls;
  int status;
  ls.rfunc = reader;
  ls.rdata = data;
  ls.chunkarg = chunkname ? chunkname : "?";
  ls.mode = mode;
  lj_buf_init(L, &ls.sb);
  status = lj_vm_cpcall(L, NULL, &ls, cpparser);
  lj_lex_cleanup(L, &ls);
  lj_gc_check(L);
  return status;
}